

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

void Hex::Hexdumper_base::clearflags(ostream *os)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)os + -0x18);
  uVar1 = __flags();
  if (uVar1 < *(uint *)(os + lVar2 + 0xc0)) {
    lVar2 = (long)(int)uVar1 * 0x10 + *(long *)(os + lVar2 + 200);
  }
  else {
    lVar2 = std::ios_base::_M_grow_words((int)(os + lVar2),SUB41(uVar1,0));
  }
  *(undefined8 *)(lVar2 + 8) = 0;
  lVar2 = *(long *)(*(long *)os + -0x18);
  uVar1 = __step();
  if (uVar1 < *(uint *)(os + lVar2 + 0xc0)) {
    lVar2 = (long)(int)uVar1 * 0x10 + *(long *)(os + lVar2 + 200);
  }
  else {
    lVar2 = std::ios_base::_M_grow_words((int)(os + lVar2),SUB41(uVar1,0));
  }
  *(undefined8 *)(lVar2 + 8) = 0;
  lVar2 = *(long *)(*(long *)os + -0x18);
  uVar1 = __threshold();
  if (uVar1 < *(uint *)(os + lVar2 + 0xc0)) {
    lVar2 = (long)(int)uVar1 * 0x10 + *(long *)(os + lVar2 + 200);
  }
  else {
    lVar2 = std::ios_base::_M_grow_words((int)(os + lVar2),SUB41(uVar1,0));
  }
  *(undefined8 *)(lVar2 + 8) = 2;
  return;
}

Assistant:

static void clearflags(std::ostream& os) {
        os.iword(__flags()) = 0;
        os.iword(__step()) = 0;
        os.iword(__threshold()) = 2;
    }